

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.c
# Opt level: O2

apx_error_t
apx_nodeData_write_require_port_data
          (apx_nodeData_t *self,apx_size_t offset,uint8_t *src,apx_size_t size)

{
  bool bVar1;
  uint uVar2;
  
  if (self == (apx_nodeData_t *)0x0) {
    uVar2 = 1;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&self->lock);
    bVar1 = (ulong)size + (ulong)offset <= (ulong)self->require_port_data_size;
    if (bVar1) {
      memcpy(self->require_port_data + offset,src,(ulong)size);
    }
    uVar2 = (uint)!bVar1;
    pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
  }
  return uVar2;
}

Assistant:

apx_error_t apx_nodeData_write_require_port_data(apx_nodeData_t* self, apx_size_t offset, uint8_t const* src, apx_size_t size)
{
   if (self != NULL)
   {
      MUTEX_LOCK(self->lock);
      if (((size_t)offset + size) > self->require_port_data_size)
      {
         MUTEX_UNLOCK(self->lock);
         return APX_INVALID_ARGUMENT_ERROR;
      }
      memcpy(self->require_port_data + offset, src, size);
      MUTEX_UNLOCK(self->lock);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}